

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# valid.c
# Opt level: O0

void * xmlCopyNotation(void *payload,xmlChar *name)

{
  xmlChar *pxVar1;
  xmlNotationPtr cur;
  xmlNotationPtr nota;
  xmlChar *name_local;
  void *payload_local;
  
  payload_local = (*xmlMalloc)(0x18);
  if ((undefined8 *)payload_local == (undefined8 *)0x0) {
    xmlVErrMemory((xmlValidCtxtPtr)0x0,"malloc failed");
    payload_local = (void *)0x0;
  }
  else {
    if (*payload == 0) {
      *(undefined8 *)payload_local = 0;
    }
    else {
      pxVar1 = xmlStrdup(*payload);
      *(xmlChar **)payload_local = pxVar1;
    }
    if (*(long *)((long)payload + 8) == 0) {
      *(undefined8 *)((long)payload_local + 8) = 0;
    }
    else {
      pxVar1 = xmlStrdup(*(xmlChar **)((long)payload + 8));
      *(xmlChar **)((long)payload_local + 8) = pxVar1;
    }
    if (*(long *)((long)payload + 0x10) == 0) {
      *(undefined8 *)((long)payload_local + 0x10) = 0;
    }
    else {
      pxVar1 = xmlStrdup(*(xmlChar **)((long)payload + 0x10));
      *(xmlChar **)((long)payload_local + 0x10) = pxVar1;
    }
  }
  return payload_local;
}

Assistant:

static void *
xmlCopyNotation(void *payload, const xmlChar *name ATTRIBUTE_UNUSED) {
    xmlNotationPtr nota = (xmlNotationPtr) payload;
    xmlNotationPtr cur;

    cur = (xmlNotationPtr) xmlMalloc(sizeof(xmlNotation));
    if (cur == NULL) {
	xmlVErrMemory(NULL, "malloc failed");
	return(NULL);
    }
    if (nota->name != NULL)
	cur->name = xmlStrdup(nota->name);
    else
	cur->name = NULL;
    if (nota->PublicID != NULL)
	cur->PublicID = xmlStrdup(nota->PublicID);
    else
	cur->PublicID = NULL;
    if (nota->SystemID != NULL)
	cur->SystemID = xmlStrdup(nota->SystemID);
    else
	cur->SystemID = NULL;
    return(cur);
}